

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Glucose::Solver::removeSatisfied(Solver *this,vec<unsigned_int> *cs)

{
  uint cr;
  uint *puVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  Clause *c;
  long lVar5;
  int local_34;
  
  iVar3 = cs->sz;
  if (iVar3 < 1) {
    local_34 = 0;
  }
  else {
    lVar5 = 0;
    local_34 = 0;
    do {
      puVar1 = cs->data;
      cr = puVar1[lVar5];
      c = (Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + cr);
      bVar2 = satisfied(this,c);
      if (bVar2) {
        removeClause(this,cr,((c->header).field_0x1 & 4) != 0);
      }
      else {
        lVar4 = (long)local_34;
        local_34 = local_34 + 1;
        puVar1[lVar4] = cr;
      }
      lVar5 = lVar5 + 1;
      iVar3 = cs->sz;
    } while (lVar5 < iVar3);
    local_34 = (int)lVar5 - local_34;
  }
  if (0 < local_34) {
    cs->sz = iVar3 - local_34;
  }
  return;
}

Assistant:

void Solver::removeSatisfied(vec <CRef> &cs) {

    int i, j;
    for(i = j = 0; i < cs.size(); i++) {
        Clause &c = ca[cs[i]];


        if(satisfied(c)) if(c.getOneWatched())
            removeClause(cs[i], true);
        else
            removeClause(cs[i]);
        else
            cs[j++] = cs[i];
    }
    cs.shrink(i - j);
}